

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

KinDynComputations * __thiscall
iDynTree::KinDynComputations::getWorldTransform(KinDynComputations *this,FrameIndex frameIndex)

{
  long lVar1;
  char cVar2;
  uint uVar3;
  Transform *pTVar4;
  long lVar5;
  long in_RDX;
  char *pcVar6;
  Transform link_H_frame;
  Transform world_H_link;
  Transform local_140 [96];
  undefined1 local_e0 [96];
  Transform local_80 [96];
  
  uVar3 = iDynTree::Model::getNrOfFrames();
  if (in_RDX < (long)(ulong)uVar3) {
    computeFwdKinematics((KinDynComputations *)frameIndex);
    if (*(char *)(*(long *)(frameIndex + 8) + 0x2f0) != '\0') {
      iDynTree::Transform::Transform((Transform *)this);
      cVar2 = iDynTree::Model::isValidLinkIndex(*(long *)(frameIndex + 8) + 8);
      if (cVar2 == '\0') {
        lVar1 = *(long *)(frameIndex + 8);
        lVar5 = iDynTree::Model::getFrameLink(lVar1 + 8);
        pTVar4 = (Transform *)
                 iDynTree::LinkPositions::operator()((LinkPositions *)(lVar1 + 0x2f8),lVar5);
        iDynTree::Transform::Transform(local_80,pTVar4);
        iDynTree::Model::getFrameTransform((long)local_e0);
        pTVar4 = local_140;
        iDynTree::Transform::operator*(pTVar4,local_80);
      }
      else {
        pTVar4 = (Transform *)
                 iDynTree::LinkPositions::operator()
                           ((LinkPositions *)(*(long *)(frameIndex + 8) + 0x2f8),in_RDX);
      }
      iDynTree::Transform::operator=((Transform *)this,pTVar4);
      return this;
    }
    pcVar6 = "error in computing fwd kinematics";
  }
  else {
    pcVar6 = "frameIndex out of bound";
  }
  iDynTree::reportError("KinDynComputations","getWorldTransform",pcVar6);
  iDynTree::Transform::Identity();
  return this;
}

Assistant:

Transform KinDynComputations::getWorldTransform(const FrameIndex frameIndex)
{
    if( frameIndex >= this->getNrOfFrames() )
    {
        reportError("KinDynComputations","getWorldTransform","frameIndex out of bound");
        return iDynTree::Transform::Identity();
    }

    // compute fwd kinematics (if necessary)
    this->computeFwdKinematics();

    if( !this->pimpl->m_isFwdKinematicsUpdated )
    {
        reportError("KinDynComputations","getWorldTransform","error in computing fwd kinematics");
        return iDynTree::Transform::Identity();
    }


    iDynTree::Transform world_H_frame;

    // If the frame is associated to a link,
    // then return directly the content in linkPos
    if( this->pimpl->m_robot_model.isValidLinkIndex(frameIndex) )
    {
        world_H_frame = this->pimpl->m_linkPos(frameIndex);
    }
    else
    {
        // otherwise we extract from the result of position kinematics
        // the transform between the world and the link at which the
        // frame is attached
        iDynTree::Transform world_H_link =
            this->pimpl->m_linkPos(this->pimpl->m_robot_model.getFrameLink(frameIndex));
        iDynTree::Transform link_H_frame =
            this->pimpl->m_robot_model.getFrameTransform(frameIndex);

        world_H_frame = world_H_link*link_H_frame;
    }

    return world_H_frame;
}